

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdflib.cpp
# Opt level: O0

double beta_rcomp(double *a,double *b,double *x,double *y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *y_local;
  double *x_local;
  double *b_local;
  double *a_local;
  
  beta_rcomp::brcomp = 0.0;
  if (((*x == 0.0) && (!NAN(*x))) || ((*y == 0.0 && (!NAN(*y))))) {
    a_local = (double *)0x0;
  }
  else {
    beta_rcomp::a0 = fifdmin1(*a,*b);
    if (beta_rcomp::a0 < 8.0) {
      if (*x <= 0.375) {
        beta_rcomp::lnx = log(*x);
        beta_rcomp::T1 = -*x;
        beta_rcomp::lny = alnrel(&beta_rcomp::T1);
      }
      else if (*y <= 0.375) {
        beta_rcomp::T2 = -*y;
        beta_rcomp::lnx = alnrel(&beta_rcomp::T2);
        beta_rcomp::lny = log(*y);
      }
      else {
        beta_rcomp::lnx = log(*x);
        beta_rcomp::lny = log(*y);
      }
      beta_rcomp::z = *a * beta_rcomp::lnx + *b * beta_rcomp::lny;
      if (1.0 <= beta_rcomp::a0) {
        dVar1 = beta_log(a,b);
        beta_rcomp::z = beta_rcomp::z - dVar1;
        a_local = (double *)exp(beta_rcomp::z);
      }
      else {
        beta_rcomp::b0 = fifdmax1(*a,*b);
        if (beta_rcomp::b0 < 8.0) {
          if (beta_rcomp::b0 <= 1.0) {
            beta_rcomp::brcomp = exp(beta_rcomp::z);
            if ((beta_rcomp::brcomp != 0.0) ||
               (a_local = (double *)beta_rcomp::brcomp, NAN(beta_rcomp::brcomp))) {
              beta_rcomp::apb = *a + *b;
              if (beta_rcomp::apb <= 1.0) {
                dVar1 = gam1(&beta_rcomp::apb);
                beta_rcomp::z = dVar1 + 1.0;
              }
              else {
                beta_rcomp::u = (*a + *b) - 1.0;
                dVar1 = gam1(&beta_rcomp::u);
                beta_rcomp::z = (dVar1 + 1.0) / beta_rcomp::apb;
              }
              dVar1 = gam1(a);
              dVar3 = gam1(b);
              beta_rcomp::c = ((dVar1 + 1.0) * (dVar3 + 1.0)) / beta_rcomp::z;
              a_local = (double *)
                        ((beta_rcomp::brcomp * beta_rcomp::a0 * beta_rcomp::c) /
                        (beta_rcomp::a0 / beta_rcomp::b0 + 1.0));
            }
          }
          else {
            beta_rcomp::u = gamma_ln1(&beta_rcomp::a0);
            beta_rcomp::n = (int)(beta_rcomp::b0 - 1.0);
            if (0 < beta_rcomp::n) {
              beta_rcomp::c = 1.0;
              for (beta_rcomp::i = 1; beta_rcomp::i <= beta_rcomp::n;
                  beta_rcomp::i = beta_rcomp::i + 1) {
                beta_rcomp::b0 = beta_rcomp::b0 - 1.0;
                beta_rcomp::c = (beta_rcomp::b0 / (beta_rcomp::a0 + beta_rcomp::b0)) * beta_rcomp::c
                ;
              }
              dVar1 = log(beta_rcomp::c);
              beta_rcomp::u = dVar1 + beta_rcomp::u;
            }
            beta_rcomp::z = beta_rcomp::z - beta_rcomp::u;
            beta_rcomp::b0 = beta_rcomp::b0 - 1.0;
            beta_rcomp::apb = beta_rcomp::a0 + beta_rcomp::b0;
            if (beta_rcomp::apb <= 1.0) {
              dVar1 = gam1(&beta_rcomp::apb);
              beta_rcomp::t = dVar1 + 1.0;
            }
            else {
              beta_rcomp::u = (beta_rcomp::a0 + beta_rcomp::b0) - 1.0;
              dVar1 = gam1(&beta_rcomp::u);
              beta_rcomp::t = (dVar1 + 1.0) / beta_rcomp::apb;
            }
            dVar1 = beta_rcomp::a0;
            dVar3 = exp(beta_rcomp::z);
            dVar2 = gam1(&beta_rcomp::b0);
            a_local = (double *)((dVar1 * dVar3 * (dVar2 + 1.0)) / beta_rcomp::t);
          }
        }
        else {
          dVar3 = gamma_ln1(&beta_rcomp::a0);
          dVar2 = algdiv(&beta_rcomp::a0,&beta_rcomp::b0);
          dVar1 = beta_rcomp::a0;
          beta_rcomp::u = dVar3 + dVar2;
          dVar3 = exp(beta_rcomp::z - beta_rcomp::u);
          a_local = (double *)(dVar1 * dVar3);
        }
      }
    }
    else {
      if (*a < *b || *a == *b) {
        beta_rcomp::h = *a / *b;
        beta_rcomp::x0 = beta_rcomp::h / (beta_rcomp::h + 1.0);
        beta_rcomp::y0 = 1.0 / (beta_rcomp::h + 1.0);
        beta_rcomp::lambda = -(*a + *b) * *x + *a;
      }
      else {
        beta_rcomp::h = *b / *a;
        beta_rcomp::x0 = 1.0 / (beta_rcomp::h + 1.0);
        beta_rcomp::y0 = beta_rcomp::h / (beta_rcomp::h + 1.0);
        beta_rcomp::lambda = (*a + *b) * *y + -*b;
      }
      dVar1 = -(beta_rcomp::lambda / *a);
      beta_rcomp::e = dVar1;
      if (ABS(dVar1) <= 0.6) {
        beta_rcomp::u = rlog1(&beta_rcomp::e);
      }
      else {
        dVar3 = log(*x / beta_rcomp::x0);
        beta_rcomp::u = dVar1 - dVar3;
      }
      dVar1 = beta_rcomp::lambda / *b;
      beta_rcomp::e = dVar1;
      if (ABS(dVar1) <= 0.6) {
        beta_rcomp::v = rlog1(&beta_rcomp::e);
      }
      else {
        dVar3 = log(*y / beta_rcomp::y0);
        beta_rcomp::v = dVar1 - dVar3;
      }
      beta_rcomp::z = exp(-(*a * beta_rcomp::u + *b * beta_rcomp::v));
      dVar1 = beta_rcomp::Const;
      dVar3 = sqrt(*b * beta_rcomp::x0);
      dVar1 = dVar1 * dVar3 * beta_rcomp::z;
      dVar3 = bcorr(a,b);
      dVar3 = exp(-dVar3);
      a_local = (double *)(dVar1 * dVar3);
    }
  }
  beta_rcomp::brcomp = (double)a_local;
  return (double)a_local;
}

Assistant:

double beta_rcomp ( double *a, double *b, double *x, double *y )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_RCOMP evaluates X**A * Y**B / Beta(A,B).
//
//  Parameters:
//
//    Input, double *A, *B, the parameters of the Beta function.
//    A and B should be nonnegative.
//
//    Input, double *X, *Y, define the numerator of the fraction.
//
//    Output, double BETA_RCOMP, the value of X**A * Y**B / Beta(A,B).
//
{
  static double Const = .398942280401433e0;
  static double brcomp,a0,apb,b0,c,e,h,lambda,lnx,lny,t,u,v,x0,y0,z;
  static int i,n;
//
//  CONST = 1/SQRT(2*PI)
//
  static double T1,T2;

    brcomp = 0.0e0;
    if(*x == 0.0e0 || *y == 0.0e0) return brcomp;
    a0 = fifdmin1(*a,*b);
    if(a0 >= 8.0e0) goto S130;
    if(*x > 0.375e0) goto S10;
    lnx = log(*x);
    T1 = -*x;
    lny = alnrel(&T1);
    goto S30;
S10:
    if(*y > 0.375e0) goto S20;
    T2 = -*y;
    lnx = alnrel(&T2);
    lny = log(*y);
    goto S30;
S20:
    lnx = log(*x);
    lny = log(*y);
S30:
    z = *a*lnx+*b*lny;
    if(a0 < 1.0e0) goto S40;
    z -= beta_log(a,b);
    brcomp = exp(z);
    return brcomp;
S40:
//
//  PROCEDURE FOR A .LT. 1 OR B .LT. 1
//
    b0 = fifdmax1(*a,*b);
    if(b0 >= 8.0e0) goto S120;
    if(b0 > 1.0e0) goto S70;
//
//  ALGORITHM FOR B0 .LE. 1
//
    brcomp = exp(z);
    if(brcomp == 0.0e0) return brcomp;
    apb = *a+*b;
    if(apb > 1.0e0) goto S50;
    z = 1.0e0+gam1(&apb);
    goto S60;
S50:
    u = *a+*b-1.e0;
    z = (1.0e0+gam1(&u))/apb;
S60:
    c = (1.0e0+gam1(a))*(1.0e0+gam1(b))/z;
    brcomp = brcomp*(a0*c)/(1.0e0+a0/b0);
    return brcomp;
S70:
//
//  ALGORITHM FOR 1 .LT. B0 .LT. 8
//
    u = gamma_ln1 ( &a0 );
    n = int( b0 - 1.0e0 );
    if(n < 1) goto S90;
    c = 1.0e0;
    for ( i = 1; i <= n; i++ )
    {
        b0 -= 1.0e0;
        c *= (b0/(a0+b0));
    }
    u = log(c)+u;
S90:
    z -= u;
    b0 -= 1.0e0;
    apb = a0+b0;
    if(apb > 1.0e0) goto S100;
    t = 1.0e0+gam1(&apb);
    goto S110;
S100:
    u = a0+b0-1.e0;
    t = (1.0e0+gam1(&u))/apb;
S110:
    brcomp = a0*exp(z)*(1.0e0+gam1(&b0))/t;
    return brcomp;
S120:
//
//  ALGORITHM FOR B0 .GE. 8
//
    u = gamma_ln1 ( &a0 ) + algdiv ( &a0, &b0 );
    brcomp = a0*exp(z-u);
    return brcomp;
S130:
//
//  PROCEDURE FOR A .GE. 8 AND B .GE. 8
//
    if(*a > *b) goto S140;
    h = *a/ *b;
    x0 = h/(1.0e0+h);
    y0 = 1.0e0/(1.0e0+h);
    lambda = *a-(*a+*b)**x;
    goto S150;
S140:
    h = *b/ *a;
    x0 = 1.0e0/(1.0e0+h);
    y0 = h/(1.0e0+h);
    lambda = (*a+*b)**y-*b;
S150:
    e = -(lambda/ *a);
    if(fabs(e) > 0.6e0) goto S160;
    u = rlog1(&e);
    goto S170;
S160:
    u = e-log(*x/x0);
S170:
    e = lambda/ *b;
    if(fabs(e) > 0.6e0) goto S180;
    v = rlog1(&e);
    goto S190;
S180:
    v = e-log(*y/y0);
S190:
    z = exp(-(*a*u+*b*v));
    brcomp = Const*sqrt(*b*x0)*z*exp(-bcorr(a,b));
    return brcomp;
}